

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::replace(QString *this,qsizetype pos,qsizetype len,QString *after)

{
  QChar *alen;
  QString *pQVar1;
  QString *in_RCX;
  qsizetype in_RDX;
  qsizetype in_RSI;
  QString *in_RDI;
  
  alen = constData((QString *)0x50bb94);
  size(in_RCX);
  pQVar1 = replace(in_RDI,in_RSI,in_RDX,(QChar *)in_RCX,(qsizetype)alen);
  return pQVar1;
}

Assistant:

QString &QString::replace(qsizetype pos, qsizetype len, const QString &after)
{
    return replace(pos, len, after.constData(), after.size());
}